

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::
HeapDisposer<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>::
disposeImpl(HeapDisposer<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>
            *this,void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  
  if (pointer != (void *)0x0) {
    if ((*(char *)((long)pointer + 0x168) == '\x01') &&
       (lVar1 = *(long *)((long)pointer + 0x170), lVar1 != 0)) {
      uVar2 = *(undefined8 *)((long)pointer + 0x178);
      *(undefined8 *)((long)pointer + 0x170) = 0;
      *(undefined8 *)((long)pointer + 0x178) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x180))
                (*(undefined8 **)((long)pointer + 0x180),lVar1,0x88,uVar2,uVar2,0);
    }
    if (*(char *)((long)pointer + 8) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x10));
    }
    ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase((ImmediatePromiseNodeBase *)pointer);
    operator_delete(pointer,0x188);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }